

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O3

UBool __thiscall icu_63::LocaleKey::fallback(LocaleKey *this)

{
  UnicodeString *this_00;
  short sVar1;
  ushort uVar2;
  int32_t iVar3;
  uint uVar4;
  int iVar5;
  
  uVar2 = (this->_currentID).fUnion.fStackFields.fLengthAndFlags;
  if ((uVar2 & 1) != 0) {
    return '\0';
  }
  this_00 = &this->_currentID;
  if ((short)uVar2 < 0) {
    iVar3 = (this->_currentID).fUnion.fFields.fLength;
  }
  else {
    iVar3 = (int)(short)uVar2 >> 5;
  }
  iVar3 = UnicodeString::doLastIndexOf(this_00,L'_',0,iVar3);
  if (iVar3 == -1) {
    if ((undefined1  [56])((undefined1  [56])(this->_fallbackID).fUnion & (undefined1  [56])0x1) ==
        (undefined1  [56])0x0) {
      UnicodeString::operator=(this_00,&this->_fallbackID);
      UnicodeString::setToBogus(&this->_fallbackID);
      return '\x01';
    }
    sVar1 = (this->_currentID).fUnion.fStackFields.fLengthAndFlags;
    uVar4 = (uint)sVar1;
    if (sVar1 < 0) {
      iVar5 = (this->_currentID).fUnion.fFields.fLength;
    }
    else {
      iVar5 = (int)uVar4 >> 5;
    }
    if (iVar5 < 1) {
      UnicodeString::setToBogus(this_00);
      return '\0';
    }
  }
  else {
    if (0 < iVar3) {
      UnicodeString::doReplace(this_00,iVar3,0x7fffffff,(UChar *)0x0,0,0);
      return '\x01';
    }
    uVar4 = (uint)(ushort)(this->_currentID).fUnion.fStackFields.fLengthAndFlags;
  }
  uVar2 = 2;
  if ((uVar4 & 1) == 0) {
    uVar2 = (ushort)uVar4 & 0x1e;
  }
  (this->_currentID).fUnion.fStackFields.fLengthAndFlags = uVar2;
  return '\x01';
}

Assistant:

inline UBool
UnicodeString::isBogus() const
{ return (UBool)(fUnion.fFields.fLengthAndFlags & kIsBogus); }